

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  lzham_uint32 lVar1;
  int iVar2;
  long lVar3;
  allocator<char> local_d9;
  string_array cmd_line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  ilzham local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  printf("LZHAM Codec - x64 Command Line Test App - Compiled %s %s\n","May  2 2025","23:33:36");
  printf("Expecting LZHAM DLL Version 0x%04X\n",0x1006);
  local_a8._vptr_ilzham = (_func_int **)&PTR__ilzham_00128d00;
  local_a8.lzham_get_version = lzham_get_version;
  local_a8.lzham_set_memory_callbacks = lzham_set_memory_callbacks;
  local_a8.lzham_compress_init = lzham_compress_init;
  local_a8.lzham_compress_deinit = lzham_compress_deinit;
  local_a8.lzham_compress = lzham_compress;
  local_a8.lzham_compress_memory = lzham_compress_memory;
  local_a8.lzham_decompress_init = lzham_decompress_init;
  local_a8.lzham_decompress_deinit = lzham_decompress_deinit;
  local_a8.lzham_decompress = lzham_decompress;
  local_a8.lzham_decompress_memory = lzham_decompress_memory;
  puts("Using static libraries.");
  lVar1 = lzham_get_version();
  printf("Loaded LZHAM DLL version 0x%04X\n\n",(ulong)lVar1);
  cmd_line.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmd_line.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmd_line.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar3 = 1; lVar3 < argc; lVar3 = lVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,argv[lVar3],&local_d9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmd_line,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,&cmd_line);
  iVar2 = main_internal(&local_c0,7,&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cmd_line);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
#endif
{
#ifdef _XBOX
   int argc = 3;
   char *argv[4] = { "", "A", "E:\\samples", "" };

   DmMapDevkitDrive();
#endif

#if defined(_M_X64) || defined(__x86_64__)
   printf("LZHAM Codec - x64 Command Line Test App - Compiled %s %s\n", __DATE__, __TIME__);
#else
   printf("LZHAM Codec - x86 Command Line Test App - Compiled %s %s\n", __DATE__, __TIME__);
#endif

   printf("Expecting LZHAM DLL Version 0x%04X\n", LZHAM_DLL_VERSION);

#if LZHAM_STATIC_LIB
   lzham_impl lzham_lib;
   lzham_lib.load();
   printf("Using static libraries.\n");
#else
   lzham_dll_loader lzham_lib;
   char lzham_dll_filename[MAX_PATH];
   lzham_dll_loader::create_module_path(lzham_dll_filename, MAX_PATH, g_is_debug);
   printf("Dynamically loading DLL \"%s\"\n", lzham_dll_filename);

   HRESULT hres = lzham_lib.load(lzham_dll_filename);
   if (FAILED(hres))
   {
      print_error("Failed loading LZHAM DLL (Status=0x%04X)!\n", (uint)hres);
      return EXIT_FAILURE;
   }
#endif

   int num_helper_threads = 0;

#ifdef _XBOX
   num_helper_threads = 5;
#elif defined(WIN32)
   SYSTEM_INFO g_system_info;
   GetSystemInfo(&g_system_info);
   if (g_system_info.dwNumberOfProcessors > 1)
   {
      num_helper_threads = g_system_info.dwNumberOfProcessors - 1;
   }
#else
   num_helper_threads = 7;
#endif

   printf("Loaded LZHAM DLL version 0x%04X\n\n", lzham_lib.lzham_get_version());

   string_array cmd_line;
   for (int i = 1; i < argc; i++)
   {
      cmd_line.push_back(std::string(argv[i]));
   }

   int exit_status = main_internal(cmd_line, num_helper_threads, lzham_lib);

   lzham_lib.unload();

   return exit_status;
}